

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::HostAddress::operator<(HostAddress *this,HostAddress *other)

{
  NetworkProtocol NVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  NVar1 = this->m_protocol;
  if (NVar1 != IPv6Protocol) {
    if ((NVar1 == IPv4Protocol) && (other->m_protocol == IPv4Protocol)) {
      return this->m_ip4Address < other->m_ip4Address;
    }
LAB_001663e7:
    return NVar1 < other->m_protocol;
  }
  if (other->m_protocol != IPv6Protocol) goto LAB_001663e7;
  uVar5 = *(ulong *)(this->m_ip6Address).data;
  uVar4 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  uVar5 = *(ulong *)(other->m_ip6Address).data;
  uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  if (uVar4 == uVar5) {
    uVar5 = *(ulong *)((this->m_ip6Address).data + 8);
    uVar2 = *(ulong *)((other->m_ip6Address).data + 8);
    uVar4 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    uVar5 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    bVar3 = 0;
    if (uVar4 == uVar5) goto LAB_001663e3;
  }
  bVar3 = (byte)(-(uint)(uVar4 < uVar5) >> 0x18);
LAB_001663e3:
  return (bool)(bVar3 >> 7);
}

Assistant:

bool HostAddress::operator<(const HostAddress& other) const
{

    // if self is IPv4
    if (m_protocol == HostAddress::IPv4Protocol) {
        if (other.m_protocol == HostAddress::IPv4Protocol) {
            return m_ip4Address < other.m_ip4Address;
        }
    }

    // if self is IPv6
    else if (m_protocol == HostAddress::IPv6Protocol) {
        if (other.m_protocol == HostAddress::IPv6Protocol) {
            return (std::memcmp(&m_ip6Address, &other.m_ip6Address, sizeof(IPv6Address)) < 0);
        }
    }

    // otherwise compare protocol types
    return m_protocol < other.m_protocol;
}